

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
::append(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
         *this,unique_ptr<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
               *item)

{
  size_t __n;
  void *__buf;
  pointer *__ptr;
  _Head_base<0UL,_supermap::io::OutputStream_*,_false> local_88;
  __uniq_ptr_impl<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>_>
  local_80;
  undefined1 local_78 [56];
  string local_40;
  
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                  *)local_78);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_40,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
              *)this);
  std::filesystem::__cxx11::path::path((path *)(local_78 + 0x10),&local_40,auto_format);
  __n = 1;
  (**(code **)(*(_func_int **)local_78._0_8_ + 8))(&local_80,local_78._0_8_,local_78 + 0x10);
  local_88._M_head_impl =
       (OutputStream *)
       local_80._M_t.
       super__Tuple_impl<0UL,_supermap::io::OutputStream_*,_std::default_delete<supermap::io::OutputStream>_>
       .super__Head_base<0UL,_supermap::io::OutputStream_*,_false>._M_head_impl;
  std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x10));
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  io::OutputIterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_void>::write
            ((OutputIterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_void> *)
             &local_88,
             (int)(item->_M_t).
                  super___uniq_ptr_impl<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
                  .
                  super__Head_base<0UL,_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_*,_false>
                  ._M_head_impl,__buf,__n);
  (**(code **)(*(long *)local_88._M_head_impl + 8))();
  (*(this->
    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
    ).
    super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
    ._vptr_Cloneable[3])
            (&(this->
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              ).
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              .register_,
             (item->_M_t).
             super___uniq_ptr_impl<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
             .super__Head_base<0UL,_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_*,_false>.
             _M_head_impl);
  if (local_88._M_head_impl != (OutputStream *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 0x18))();
  }
  return;
}

Assistant:

void append(std::unique_ptr<T> &&item) override {
        io::OutputIterator<T> writer = getFileManager()->template getOutputIterator<T>(getStorageFilePath(), true);
        writer.write(*item);
        writer.flush();
        getRegister().registerItem(*item);
    }